

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

uint32 scanner_block_hash_fn(ScannerBlock *b,hash_fns_t *fns)

{
  uint32 uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  
  pvVar3 = (void *)0x0;
  pvVar2 = fns->data[0];
  if ((long)fns->data[0] < 1) {
    pvVar2 = pvVar3;
  }
  uVar1 = 0;
  for (; pvVar2 != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
    iVar4 = 1;
    if (b->chars[(long)pvVar3] != (ScanState *)0x0) {
      iVar4 = b->chars[(long)pvVar3]->index + 2;
    }
    uVar1 = uVar1 * 0x11 + iVar4;
  }
  return uVar1;
}

Assistant:

static uint32 scanner_block_hash_fn(ScannerBlock *b, hash_fns_t *fns) {
  uint32 hash = 0;
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanState **sb = b->chars;

  for (i = 0; i < block_size; i++) {
    hash *= 17;
    hash += sb[i] ? sb[i]->index + 2 : 1;
  }
  return hash;
}